

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>
          (enum_<asd::data_kind> *this,handle *scope,char *name,arithmetic *extra)

{
  is_new_style_constructor local_62;
  type local_61;
  handle local_60;
  undefined1 local_58 [16];
  char *local_48;
  object local_40;
  arg local_38;
  is_method local_28;
  name local_20;
  
  class_<asd::data_kind>::class_<pybind11::arithmetic>
            (&this->super_class_<asd::data_kind>,(handle)scope->m_ptr,name,extra);
  (this->m_base).m_base.m_ptr =
       (this->super_class_<asd::data_kind>).super_generic_type.super_object.super_handle.m_ptr;
  (this->m_base).m_parent.m_ptr = scope->m_ptr;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x1);
  local_58._0_8_ = "value";
  local_58[8] = 2;
  class_<asd::data_kind>::
  def<pybind11::detail::initimpl::factory<pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(int)_1_,pybind11::detail::void_type(*)(),asd::data_kind(int),pybind11::detail::void_type()>::execute<pybind11::class_<asd::data_kind>,pybind11::arg>(pybind11::class_<asd::data_kind>&,pybind11::arg_const&)&&::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::arg>
            (&this->super_class_<asd::data_kind>,"__init__",(type *)&local_38,
             (is_new_style_constructor *)&local_60,(arg *)local_58);
  class_<asd::data_kind>::
  def_property_readonly<pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::data_kind)_1_>
            (&this->super_class_<asd::data_kind>,"value",(anon_class_1_0_00000001 *)local_58);
  class_<asd::data_kind>::
  def<pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::data_kind)_2_>
            (&this->super_class_<asd::data_kind>,"__int__",(type *)local_58);
  class_<asd::data_kind>::
  def<pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::data_kind)_3_>
            (&this->super_class_<asd::data_kind>,"__index__",(type *)local_58);
  local_20.value = "__setstate__";
  local_28.class_.m_ptr =
       (handle)(this->super_class_<asd::data_kind>).super_generic_type.super_object.super_handle.
               m_ptr;
  local_38.name = "state";
  local_38._8_1_ = 2;
  cpp_function::
  cpp_function<pybind11::enum_<asd::data_kind>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            ((cpp_function *)&local_60,&local_61,&local_62,&local_20,&local_28,&local_38);
  local_58._8_8_ =
       (this->super_class_<asd::data_kind>).super_generic_type.super_object.super_handle.m_ptr;
  local_48 = "__setstate__";
  local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor_policies::str_attr::set((handle)local_58._8_8_,"__setstate__",local_60);
  object::~object(&local_40);
  object::~object((object *)&local_60);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra &...extra)
        : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Underlying>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def_property_readonly("value", [](Type value) { return (Scalar) value; });
        def("__int__", [](Type value) { return (Scalar) value; });
        def("__index__", [](Type value) { return (Scalar) value; });
        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(
                    v_h, static_cast<Type>(arg), Py_TYPE(v_h.inst) != v_h.type->type);
            },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"),
            is_method(*this),
            arg("state"));
    }